

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::Transaction::GetSchnorrSignatureHash
          (ByteData256 *__return_storage_ptr__,Transaction *this,uint32_t txin_index,
          SigHashType *sighash_type,
          vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *utxo_list,
          TapScriptData *script_data,ByteData *annex)

{
  pointer pTVar1;
  AbstractTxOut *pAVar2;
  bool bVar3;
  uint8_t uVar4;
  bool bVar5;
  WitnessVersion WVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  SigHashAlgorithm SVar9;
  ulong uVar10;
  undefined7 extraout_var;
  int64_t iVar11;
  CfdException *pCVar12;
  TxOut *txout;
  long lVar13;
  AbstractTxOut *this_00;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  Amount AVar17;
  undefined1 local_1e0 [8];
  int local_1d8;
  char *local_1d0;
  uint32_t local_1a4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1a0;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_188;
  int local_17c;
  Serializer builder;
  Serializer prevouts_buf;
  Serializer amounts_buf;
  Script locking_script;
  ByteData256 top;
  Serializer sequences_buf;
  Serializer scripts_buf;
  
  local_1a4 = txin_index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)txin_index,0x32e,"GetSchnorrSignatureHash");
  local_188 = utxo_list;
  if ((ulong)(((long)(utxo_list->
                     super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(utxo_list->
                    super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>)._M_impl
                    .super__Vector_impl_data._M_start) / 0x50) <
      (ulong)(((long)(this->vin_).
                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->vin_).
                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x90)) {
    locking_script._vptr_Script = (_func_int **)0x5e023f;
    locking_script.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x330;
    locking_script.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "GetSchnorrSignatureHash";
    logger::warn<>((CfdSourceLocation *)&locking_script,"not enough utxo list.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&locking_script,"not enough utxo list.",(allocator *)local_1e0);
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&locking_script);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar3 = ByteData::IsEmpty(annex);
  if (!bVar3) {
    uVar4 = ByteData::GetHeadData(annex);
    if (uVar4 != 'P') {
      locking_script._vptr_Script = (_func_int **)0x5e023f;
      locking_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x334;
      locking_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "GetSchnorrSignatureHash";
      logger::warn<>((CfdSourceLocation *)&locking_script,"invalid annex tag.");
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&locking_script,"invalid annex tag",(allocator *)local_1e0);
      CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&locking_script);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  uVar10 = (ulong)local_1a4;
  AbstractTxOut::GetLockingScript
            (&locking_script,
             &(local_188->super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxOut);
  bVar3 = Script::IsWitnessProgram(&locking_script);
  if (!bVar3) {
    local_1e0 = (undefined1  [8])0x5e023f;
    local_1d8 = 0x33a;
    local_1d0 = "GetSchnorrSignatureHash";
    logger::warn<>((CfdSourceLocation *)local_1e0,"target vin is not segwit.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_1e0,"target vin is not segwit.",(allocator *)&builder);
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1e0);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WVar6 = Script::GetWitnessVersion(&locking_script);
  if (WVar6 != kVersion1) {
    local_1e0 = (undefined1  [8])0x5e023f;
    local_1d8 = 0x33d;
    local_1d0 = "GetSchnorrSignatureHash";
    logger::warn<>((CfdSourceLocation *)local_1e0,"target vin is not segwit v1.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_1e0,"target vin is not segwit v1.",(allocator *)&builder);
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1e0);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar7 = SigHashType::GetSigHashFlag(sighash_type);
  bVar3 = SigHashType::IsAnyoneCanPay(sighash_type);
  bVar5 = SchnorrSignature::IsValidSigHashType((uint8_t)uVar7);
  if (bVar5) {
    if (script_data == (TapScriptData *)0x0) {
      uVar14 = 0;
      local_17c = 0;
    }
    else {
      bVar5 = ByteData256::IsEmpty(&script_data->tap_leaf_hash);
      uVar14 = CONCAT71(extraout_var,bVar5) & 0xffffffff ^ 1;
      local_17c = (int)uVar14 * 2;
    }
    Serializer::Serializer(&builder);
    ::std::__cxx11::string::string((string *)local_1e0,"TapSighash",(allocator *)&prevouts_buf);
    HashUtil::Sha256(&top,(string *)local_1e0);
    ::std::__cxx11::string::~string((string *)local_1e0);
    Serializer::AddDirectBytes(&builder,&top);
    Serializer::AddDirectBytes(&builder,&top);
    Serializer::AddDirectByte(&builder,'\0');
    uVar8 = SigHashType::GetSigHashFlag(sighash_type);
    Serializer::AddDirectByte(&builder,(uint8_t)uVar8);
    uVar8 = AbstractTransaction::GetVersion(&this->super_AbstractTransaction);
    Serializer::AddDirectNumber(&builder,uVar8);
    uVar8 = AbstractTransaction::GetLockTime(&this->super_AbstractTransaction);
    Serializer::AddDirectNumber(&builder,uVar8);
    if (!bVar3) {
      Serializer::Serializer(&prevouts_buf);
      Serializer::Serializer(&amounts_buf);
      Serializer::Serializer(&scripts_buf);
      Serializer::Serializer(&sequences_buf);
      lVar15 = 0;
      lVar13 = 0;
      for (uVar16 = 0;
          pTVar1 = (this->vin_).
                   super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar16 < (ulong)(((long)(this->vin_).
                                  super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x90)
          ; uVar16 = uVar16 + 1) {
        AbstractTxIn::GetTxid
                  ((Txid *)local_1e0,
                   (AbstractTxIn *)((long)&(pTVar1->super_AbstractTxIn)._vptr_AbstractTxIn + lVar13)
                  );
        Txid::GetData((ByteData *)&local_1a0,(Txid *)local_1e0);
        Serializer::AddDirectBytes(&prevouts_buf,(ByteData *)&local_1a0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_1a0);
        Txid::~Txid((Txid *)local_1e0);
        uVar8 = AbstractTxIn::GetVout
                          ((AbstractTxIn *)
                           ((long)&(((this->vin_).
                                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn)
                                   ._vptr_AbstractTxIn + lVar13));
        Serializer::AddDirectNumber(&prevouts_buf,uVar8);
        AVar17 = AbstractTxOut::GetValue
                           ((AbstractTxOut *)
                            ((long)&(((local_188->
                                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super_AbstractTxOut)._vptr_AbstractTxOut + lVar15));
        local_1e0 = (undefined1  [8])AVar17.amount_;
        local_1d8 = CONCAT31(local_1d8._1_3_,AVar17.ignore_check_);
        iVar11 = Amount::GetSatoshiValue((Amount *)local_1e0);
        Serializer::AddDirectNumber(&amounts_buf,iVar11);
        AbstractTxOut::GetLockingScript
                  ((Script *)local_1e0,
                   (AbstractTxOut *)
                   ((long)&(((local_188->
                             super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                             )._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut).
                           _vptr_AbstractTxOut + lVar15));
        Script::GetData((ByteData *)&local_1a0,(Script *)local_1e0);
        Serializer::AddVariableBuffer(&scripts_buf,(ByteData *)&local_1a0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_1a0);
        Script::~Script((Script *)local_1e0);
        uVar8 = AbstractTxIn::GetSequence
                          ((AbstractTxIn *)
                           ((long)&(((this->vin_).
                                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn)
                                   ._vptr_AbstractTxIn + lVar13));
        Serializer::AddDirectNumber(&sequences_buf,uVar8);
        lVar13 = lVar13 + 0x90;
        lVar15 = lVar15 + 0x50;
      }
      Serializer::Output((ByteData *)&local_1a0,&prevouts_buf);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&local_1a0);
      Serializer::AddDirectBytes(&builder,(ByteData256 *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a0);
      Serializer::Output((ByteData *)&local_1a0,&amounts_buf);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&local_1a0);
      Serializer::AddDirectBytes(&builder,(ByteData256 *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a0);
      Serializer::Output((ByteData *)&local_1a0,&scripts_buf);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&local_1a0);
      Serializer::AddDirectBytes(&builder,(ByteData256 *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a0);
      Serializer::Output((ByteData *)&local_1a0,&sequences_buf);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&local_1a0);
      Serializer::AddDirectBytes(&builder,(ByteData256 *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a0);
      Serializer::~Serializer(&sequences_buf);
      Serializer::~Serializer(&scripts_buf);
      Serializer::~Serializer(&amounts_buf);
      Serializer::~Serializer(&prevouts_buf);
    }
    if ((uint8_t)uVar7 == '\0' || (uVar7 & 0xf) == 1) {
      Serializer::Serializer(&prevouts_buf);
      pAVar2 = &((this->vout_).
                 super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish)->super_AbstractTxOut;
      for (this_00 = &((this->vout_).
                       super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                       _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut;
          this_00 != pAVar2; this_00 = this_00 + 1) {
        AVar17 = AbstractTxOut::GetValue(this_00);
        local_1e0 = (undefined1  [8])AVar17.amount_;
        local_1d8 = CONCAT31(local_1d8._1_3_,AVar17.ignore_check_);
        iVar11 = Amount::GetSatoshiValue((Amount *)local_1e0);
        Serializer::AddDirectNumber(&prevouts_buf,iVar11);
        AbstractTxOut::GetLockingScript((Script *)local_1e0,this_00);
        Script::GetData((ByteData *)&amounts_buf,(Script *)local_1e0);
        Serializer::AddVariableBuffer(&prevouts_buf,(ByteData *)&amounts_buf);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&amounts_buf);
        Script::~Script((Script *)local_1e0);
      }
      Serializer::Output((ByteData *)&amounts_buf,&prevouts_buf);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&amounts_buf);
      Serializer::AddDirectBytes(&builder,(ByteData256 *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&amounts_buf);
      Serializer::~Serializer(&prevouts_buf);
    }
    bVar5 = ByteData::IsEmpty(annex);
    Serializer::AddDirectByte(&builder,(byte)local_17c | !bVar5);
    uVar7 = local_1a4;
    if (bVar3) {
      AbstractTxIn::GetTxid
                ((Txid *)local_1e0,
                 &(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxIn);
      Txid::GetData((ByteData *)&prevouts_buf,(Txid *)local_1e0);
      Serializer::AddDirectBytes(&builder,(ByteData *)&prevouts_buf);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prevouts_buf);
      Txid::~Txid((Txid *)local_1e0);
      uVar7 = AbstractTxIn::GetVout
                        (&(this->vin_).
                          super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxIn);
      Serializer::AddDirectNumber(&builder,uVar7);
      AVar17 = AbstractTxOut::GetValue
                         (&(local_188->
                           super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxOut);
      local_1e0 = (undefined1  [8])AVar17.amount_;
      local_1d8 = CONCAT31(local_1d8._1_3_,AVar17.ignore_check_);
      iVar11 = Amount::GetSatoshiValue((Amount *)local_1e0);
      Serializer::AddDirectNumber(&builder,iVar11);
      AbstractTxOut::GetLockingScript
                ((Script *)local_1e0,
                 &(local_188->
                  super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar10].super_AbstractTxOut);
      Script::GetData((ByteData *)&prevouts_buf,(Script *)local_1e0);
      Serializer::AddVariableBuffer(&builder,(ByteData *)&prevouts_buf);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prevouts_buf);
      Script::~Script((Script *)local_1e0);
      uVar7 = AbstractTxIn::GetSequence
                        (&(this->vin_).
                          super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxIn);
    }
    Serializer::AddDirectNumber(&builder,uVar7);
    bVar3 = ByteData::IsEmpty(annex);
    if (!bVar3) {
      HashUtil::Sha256((ByteData256 *)local_1e0,annex);
      Serializer::AddDirectBytes(&builder,(ByteData256 *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
    }
    SVar9 = SigHashType::GetSigHashAlgorithm(sighash_type);
    if (SVar9 == kSigHashSingle) {
      (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
                (this,(ulong)local_1a4,0x38b,"GetSchnorrSignatureHash");
      Serializer::Serializer(&prevouts_buf);
      AVar17 = AbstractTxOut::GetValue
                         (&(this->vout_).
                           super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxOut);
      local_1e0 = (undefined1  [8])AVar17.amount_;
      local_1d8 = CONCAT31(local_1d8._1_3_,AVar17.ignore_check_);
      iVar11 = Amount::GetSatoshiValue((Amount *)local_1e0);
      Serializer::AddDirectNumber(&prevouts_buf,iVar11);
      AbstractTxOut::GetLockingScript
                ((Script *)local_1e0,
                 &(this->vout_).
                  super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10].super_AbstractTxOut);
      Script::GetData((ByteData *)&amounts_buf,(Script *)local_1e0);
      Serializer::AddVariableBuffer(&prevouts_buf,(ByteData *)&amounts_buf);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&amounts_buf);
      Script::~Script((Script *)local_1e0);
      Serializer::Output((ByteData *)&amounts_buf,&prevouts_buf);
      HashUtil::Sha256((ByteData256 *)local_1e0,(ByteData *)&amounts_buf);
      Serializer::AddDirectBytes(&builder,(ByteData256 *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&amounts_buf);
      Serializer::~Serializer(&prevouts_buf);
    }
    if ((char)uVar14 != '\0') {
      ByteData256::GetData((ByteData *)local_1e0,&script_data->tap_leaf_hash);
      Serializer::AddDirectBytes(&builder,(ByteData *)local_1e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
      Serializer::AddDirectByte(&builder,'\0');
      Serializer::AddDirectNumber(&builder,script_data->code_separator_position);
    }
    Serializer::Output((ByteData *)local_1e0,&builder);
    HashUtil::Sha256(__return_storage_ptr__,(ByteData *)local_1e0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&top);
    Serializer::~Serializer(&builder);
    Script::~Script(&locking_script);
    return __return_storage_ptr__;
  }
  local_1e0 = (undefined1  [8])0x5e023f;
  local_1d8 = 0x346;
  local_1d0 = "GetSchnorrSignatureHash";
  logger::warn<>((CfdSourceLocation *)local_1e0,"Invalid sighash type on segwit v1.");
  pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_1e0,"Invalid sighash type on segwit v1.",(allocator *)&builder);
  CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1e0);
  __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 Transaction::GetSchnorrSignatureHash(
    uint32_t txin_index, SigHashType sighash_type,
    const std::vector<TxOut> &utxo_list, const TapScriptData *script_data,
    const ByteData &annex) const {
  CheckTxInIndex(txin_index, __LINE__, __FUNCTION__);
  if (this->vin_.size() > utxo_list.size()) {
    warn(CFD_LOG_SOURCE, "not enough utxo list.");
    throw CfdException(kCfdIllegalArgumentError, "not enough utxo list.");
  }
  if ((!annex.IsEmpty()) && (annex.GetHeadData() != TaprootUtil::kAnnexTag)) {
    warn(CFD_LOG_SOURCE, "invalid annex tag.");
    throw CfdException(kCfdIllegalArgumentError, "invalid annex tag");
  }

  const Script locking_script = utxo_list[txin_index].GetLockingScript();
  if (!locking_script.IsWitnessProgram()) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit.");
    throw CfdException(kCfdIllegalArgumentError, "target vin is not segwit.");
  } else if (locking_script.GetWitnessVersion() != WitnessVersion::kVersion1) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "target vin is not segwit v1.");
  }

  uint8_t sighash_type_value =
      static_cast<uint8_t>(sighash_type.GetSigHashFlag());
  bool is_anyone_can_pay = sighash_type.IsAnyoneCanPay();
  if (!SchnorrSignature::IsValidSigHashType(sighash_type_value)) {
    warn(CFD_LOG_SOURCE, "Invalid sighash type on segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "Invalid sighash type on segwit v1.");
  } else if (sighash_type_value == 0) {
    sighash_type_value = 0x01;  // SIGHASH_ALL
  }
  bool has_sighash_all = ((sighash_type_value & 0x0f) == 1) ? true : false;

  uint8_t ext_flag = 0;  // 0 - 127
  uint8_t has_tap_script = 0;
  uint8_t key_version = 0;
  if ((script_data != nullptr) && (!script_data->tap_leaf_hash.IsEmpty())) {
    has_tap_script = 1;
  }
  ext_flag |= has_tap_script;

  Serializer builder;
  auto top = HashUtil::Sha256("TapSighash");
  builder.AddDirectBytes(top);
  builder.AddDirectBytes(top);  // double data
  builder.AddDirectByte(0);     // EPOCH
  builder.AddDirectByte(static_cast<uint8_t>(sighash_type.GetSigHashFlag()));
  builder.AddDirectNumber(static_cast<uint32_t>(GetVersion()));
  builder.AddDirectNumber(GetLockTime());
  if (!is_anyone_can_pay) {
    Serializer prevouts_buf;
    Serializer amounts_buf;
    Serializer scripts_buf;
    Serializer sequences_buf;
    for (size_t index = 0; index < vin_.size(); ++index) {
      prevouts_buf.AddDirectBytes(vin_[index].GetTxid().GetData());
      prevouts_buf.AddDirectNumber(vin_[index].GetVout());
      amounts_buf.AddDirectNumber(
          utxo_list[index].GetValue().GetSatoshiValue());
      scripts_buf.AddVariableBuffer(
          utxo_list[index].GetLockingScript().GetData());
      sequences_buf.AddDirectNumber(vin_[index].GetSequence());
    }
    builder.AddDirectBytes(HashUtil::Sha256(prevouts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(amounts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(scripts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(sequences_buf.Output()));
  }
  if (has_sighash_all) {
    Serializer outputs_buf;
    for (const auto &txout : vout_) {
      outputs_buf.AddDirectNumber(txout.GetValue().GetSatoshiValue());
      outputs_buf.AddVariableBuffer(txout.GetLockingScript().GetData());
    }
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  uint8_t spend_type = (ext_flag << 1) + (annex.IsEmpty() ? 0 : 1);
  builder.AddDirectByte(spend_type);
  if (is_anyone_can_pay) {
    builder.AddDirectBytes(vin_[txin_index].GetTxid().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetVout());
    builder.AddDirectNumber(
        utxo_list[txin_index].GetValue().GetSatoshiValue());
    builder.AddVariableBuffer(
        utxo_list[txin_index].GetLockingScript().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetSequence());
  } else {
    builder.AddDirectNumber(txin_index);
  }

  if (!annex.IsEmpty()) builder.AddDirectBytes(HashUtil::Sha256(annex));

  if (sighash_type.GetSigHashAlgorithm() == SigHashAlgorithm::kSigHashSingle) {
    CheckTxOutIndex(txin_index, __LINE__, __FUNCTION__);
    Serializer outputs_buf;
    outputs_buf.AddDirectNumber(
        vout_[txin_index].GetValue().GetSatoshiValue());
    outputs_buf.AddVariableBuffer(
        vout_[txin_index].GetLockingScript().GetData());
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  if (has_tap_script == 1) {
    builder.AddDirectBytes(script_data->tap_leaf_hash.GetData());
    builder.AddDirectByte(key_version);
    builder.AddDirectNumber(script_data->code_separator_position);
  }
  return HashUtil::Sha256(builder.Output());
}